

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O2

int fits_make_longstr_key_util
              (fitsfile *fptr,char *keyname,char *value,char *comm,int position,int *status)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  char *pcVar15;
  int local_244;
  size_t local_240;
  int tstatus;
  undefined8 local_200;
  char valstring [81];
  char comstring [81];
  char local_138 [74];
  undefined1 local_ee;
  char card [81];
  char tstring [81];
  
  tstatus = -1;
  if (0 < *status) {
    return *status;
  }
  local_240 = strlen(value);
  local_200 = value;
  if (comm == (char *)0x0) {
    sVar6 = 0;
  }
  else {
    sVar6 = strlen(comm);
  }
  pcVar15 = keyname + -1;
  do {
    pcVar1 = pcVar15 + 1;
    pcVar15 = pcVar15 + 1;
  } while (*pcVar1 == ' ');
  strncpy(local_138,pcVar15,0x4a);
  local_ee = 0;
  sVar7 = strlen(local_138);
  if ((int)sVar7 == 0) {
    iVar12 = 0;
LAB_001b307e:
    iVar5 = fftkey(pcVar15,&tstatus);
    if (iVar5 < 1) {
      iVar5 = 0x44;
      iVar12 = 10;
      goto LAB_001b312f;
    }
    if (iVar12 != 0) goto LAB_001b3093;
    iVar12 = 0xb;
  }
  else {
    pcVar15 = local_138 + (int)sVar7;
    while (pcVar15 = pcVar15 + -1, *pcVar15 == ' ') {
      *pcVar15 = '\0';
    }
    sVar7 = strlen(local_138);
    iVar12 = (int)sVar7;
    if (iVar12 < 9) goto LAB_001b307e;
LAB_001b3093:
    if (local_138[0] == 'h') {
      pcVar15 = "hierarch ";
LAB_001b30c8:
      iVar5 = bcmp(local_138,pcVar15,9);
      if (iVar5 == 0) {
        iVar12 = iVar12 + 2;
        goto LAB_001b3123;
      }
    }
    else if (local_138[0] == 'H') {
      pcVar15 = "HIERARCH ";
      goto LAB_001b30c8;
    }
    if (0x45 < iVar12) {
      ffpmsg("The following keyword is too long to fit on a card in ffpkls:");
      ffpmsg(keyname);
      *status = 0xcf;
      return 0xcf;
    }
    iVar12 = iVar12 + 0xb;
  }
LAB_001b3123:
  iVar5 = 0x4e - iVar12;
LAB_001b312f:
  bVar9 = true;
  bVar4 = true;
  local_244 = 0;
  bVar2 = false;
  bVar3 = false;
  do {
    iVar13 = (int)sVar6;
    if (!bVar9) {
      return *status;
    }
    if (bVar2) {
      if (iVar13 < 0x30) {
        valstring[0] = '\'';
        valstring[1] = '\'';
        valstring[2] = ' ';
      }
      else {
        valstring[0] = '\'';
        valstring[1] = '&';
        valstring[2] = '\'';
      }
      builtin_strncpy(valstring + 3,"                 ",0x12);
      iVar11 = 0x2f;
      if (iVar13 < 0x2f) {
        iVar11 = iVar13;
      }
      strncpy(comstring,comm + local_244,(long)iVar11);
      comstring[iVar11] = '\0';
      local_244 = local_244 + iVar11;
      sVar6 = (size_t)(uint)(iVar13 - iVar11);
      bVar9 = true;
      bVar2 = true;
    }
    else {
      pcVar15 = local_200 + local_244;
      sVar7 = strlen(pcVar15);
      iVar11 = 0;
      for (lVar8 = 0; (iVar10 = (int)lVar8, lVar8 < (int)sVar7 && (iVar10 + iVar11 < iVar5));
          lVar8 = lVar8 + 1) {
        iVar11 = iVar11 + (uint)(pcVar15[lVar8] == '\'');
      }
      iVar14 = iVar5 - iVar11;
      if (iVar10 < iVar5 - iVar11) {
        iVar14 = iVar10;
      }
      tstring[0] = '\0';
      strncat(tstring,pcVar15,(long)iVar14);
      if (bVar4) {
        ffs2c(tstring,valstring,status);
        sVar7 = strlen(valstring);
        iVar11 = (int)sVar7;
        iVar10 = 0x50 - (iVar12 + iVar11);
        if ((((int)local_240 != iVar14) || (0x2e < iVar13)) || (0x4d < iVar12 + iVar13 + iVar11))
        goto LAB_001b3305;
      }
      else {
        ffs2c_nopad(tstring,valstring,status);
        sVar7 = strlen(valstring);
        iVar11 = (int)sVar7;
        iVar10 = 0x46 - iVar11;
LAB_001b3305:
        if (!bVar3) {
          lVar8 = (long)iVar11;
          if (iVar10 == 0) {
            if ((iVar13 != 0) || (iVar14 < (int)local_240)) {
              iVar14 = iVar14 + -1;
              if (valstring[lVar8 + -2] == '\'') {
                valstring[lVar8 + -3] = '&';
                valstring[lVar8 + -1] = '\0';
              }
              else {
                valstring[lVar8 + -2] = '&';
              }
            }
          }
          else if ((iVar14 < (int)local_240) ||
                  ((iVar13 != 0 && (((iVar10 < 0x32 || (0x2f < iVar13)) || (iVar10 + -3 < iVar13))))
                  )) {
            (valstring + lVar8 + -1)[0] = '&';
            (valstring + lVar8 + -1)[1] = '\'';
            valstring[lVar8 + 1] = '\0';
          }
          if ((int)local_240 - iVar14 == 0 || (int)local_240 < iVar14) {
            if (iVar13 == 0) {
              sVar6 = 0;
LAB_001b3444:
              local_244 = 0;
              bVar9 = false;
            }
            else {
              if (iVar10 < 0x32) goto LAB_001b3444;
              local_244 = 0x2f;
              if (iVar13 < 0x2f) {
                local_244 = iVar13;
              }
              strncpy(comstring,comm,(long)local_244);
              comstring[local_244] = '\0';
              sVar6 = (size_t)(uint)(iVar13 - local_244);
              bVar9 = true;
            }
            local_240 = 0;
            bVar2 = true;
          }
          else {
            local_244 = local_244 + iVar14;
            bVar9 = false;
            iVar5 = 0x44;
            bVar2 = false;
            local_240 = (ulong)(uint)((int)local_240 - iVar14);
          }
          bVar3 = false;
          goto LAB_001b3451;
        }
      }
      if (comm == (char *)0x0) {
        comstring[0] = '\0';
      }
      else {
        strcpy(comstring,comm);
      }
      bVar9 = true;
      local_240 = 0;
      sVar6 = 0;
      bVar2 = false;
      bVar3 = true;
    }
LAB_001b3451:
    if (bVar4) {
      if (bVar9) {
        pcVar15 = comstring;
      }
      else {
        pcVar15 = (char *)0x0;
      }
      ffmkky(keyname,valstring,pcVar15,card,status);
    }
    else {
      if (bVar9) {
        pcVar15 = comstring;
      }
      else {
        pcVar15 = (char *)0x0;
      }
      ffmkky("CONTINUE",valstring,pcVar15,card,status);
      card[8] = ' ';
      card[9] = ' ';
    }
    if (position < 0) {
      ffprec(fptr,card,status);
    }
    else {
      ffirec(fptr,position,card,status);
      position = position + 1;
    }
    bVar9 = 0 < (int)sVar6 || 0 < (int)local_240;
    bVar4 = false;
  } while( true );
}

Assistant:

int fits_make_longstr_key_util( fitsfile *fptr,     /* I - FITS file pointer        */
            const char *keyname,/* I - name of keyword to write */
            const char *value,  /* I - keyword value            */
            const char *comm,   /* I - keyword comment          */
            int position,       /* I - position to insert (-1 for end) */
            int  *status)       /* IO - error status            */
/*
  Write (put) the keyword, value and comment into the FITS header.
  This routine is a modified version of ffpkys which supports the
  HEASARC long string convention and can write arbitrarily long string
  keyword values.  The value is continued over multiple keywords that
  have the name CONTINUE without an equal sign in column 9 of the card.
  This routine also supports simple string keywords which are less than
  75 characters in length.
*/
{
    char valstring[FLEN_CARD], comstring[FLEN_CARD];
    /* give tmpkeyname same size restriction as in ffmkky */
    char card[FLEN_CARD], tmpkeyname[FLEN_KEYWORD];
    char tstring[FLEN_CARD], *cptr;
    int next, remainval, remaincom, vlen, nquote, nchar; 
    int namelen, finalnamelen, maxvalchars;
    int contin, tstatus=-1, nocomment=0, ichar, addline=1;
    int spaceForComments=0, processingComment=0, nblanks=0, allInOne=0;
    /* This setting is arbitrary */
    int fixedSpaceForComments = 50;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    remainval = strlen(value);   
    if (comm)
       remaincom = strlen(comm);
    else
       remaincom = 0;

    tmpkeyname[0] = '\0';    
    cptr = keyname;
    while(*cptr == ' ')   /* skip over leading spaces in name */
        cptr++;
        
    strncpy(tmpkeyname, cptr, FLEN_KEYWORD-1);
    tmpkeyname[FLEN_KEYWORD-1] = '\0';
    
    namelen = strlen(tmpkeyname);
    if (namelen)         /* skip trailing spaces in name */
    {
       cptr = tmpkeyname + namelen - 1;
       while (*cptr == ' ')
       {
          *cptr = '\0';
          cptr--;
       }
       namelen = strlen(tmpkeyname);
    }
    
    /* First determine final length of keyword.  ffmkky may prepend 
       "HIERARCH " to it, and we need to determine that now using the
       same criteria as ffmkky. */
    
    if (namelen <= 8 && (fftkey(cptr, &tstatus) <= 0) )
    {
       /* This a normal 8-character FITS keyword. ffmkky
          will pad it to 8 if necessary, and add "= ". */
       finalnamelen = 10;
       /* 2 additional chars are needed for opening/closing quotes. */
       maxvalchars = (FLEN_CARD-1) - finalnamelen  - 2;
    }
    else
    { 
       if (namelen && ((FSTRNCMP(tmpkeyname, "HIERARCH ", 9) == 0) ||
                   (FSTRNCMP(tmpkeyname, "hierarch ", 9) == 0)) )
       {
          /* We have an explicitly marked long keyword, so HIERARCH
             will not be prepended.  However it can then have
             " = " or "= ", depending on size of value string. 
             For now, assume "= ". 
             
             If we're here, must have 75 > namelen > 9. */
          finalnamelen = namelen + 2;
       }
       else
       {
          /* ffmkky is going to prepend "HIERARCH " to the keyword,
             and " = " or "= ". */
          finalnamelen = namelen + 11;
          if (finalnamelen > FLEN_CARD-1)
          {
             ffpmsg("The following keyword is too long to fit on a card in ffpkls:");
             ffpmsg(keyname);
             return(*status = BAD_KEYCHAR);
          }
       }
       maxvalchars = (FLEN_CARD-1) - finalnamelen - 2;       
    }
    
    contin = 0;
    next = 0;                  /* pointer to next character to write */

    while (addline)
    {
        if (processingComment)
        {
           if (remaincom > (fixedSpaceForComments-3))
           {
              strcpy(valstring,"'&'");
              nblanks = (FLEN_CARD-1) - fixedSpaceForComments - 13;
              memset(&valstring[3], 32, nblanks);
              valstring[nblanks+3] = '\0';
           }
           else
           {
              strcpy(valstring,"''");
              nblanks = (FLEN_CARD-1) - fixedSpaceForComments - 12;
              memset(&valstring[2], 32, nblanks);
              valstring[nblanks+2] = '\0';
           }
           nchar = minvalue(remaincom, fixedSpaceForComments-3);
           strncpy(comstring, &comm[next], nchar);
           comstring[nchar] = '\0';
           next += nchar;
           remaincom -= nchar;
        }
        else
        {
           vlen = strlen(&value[next]);
           nquote = 0;
           for (ichar=0; ichar<vlen && (ichar+nquote)<maxvalchars; ++ichar)
           {
              if (value[next+ichar] == '\'')
                 ++nquote;
           }
           /* Note that (ichar+nquote) can be 1 greater than maxvalchars
              if last processed char is a quote.  Therefore do this check: */
           nchar = minvalue(ichar,(maxvalchars-nquote));
    
           tstring[0] = '\0';
           strncat(tstring, &value[next], nchar); /* copy string to temp buff */
           /* expand quotes, and put quotes around the string */
           if (contin)
           {
              ffs2c_nopad(tstring,valstring,status);
              vlen = strlen(valstring);
              spaceForComments = (FLEN_CARD-1) - (10 + vlen);
           }
           else
           {
              ffs2c(tstring, valstring, status);
              vlen = strlen(valstring);
              spaceForComments = (FLEN_CARD-1) - (finalnamelen + vlen);
           }
           
           /* Check for simplest case where everything fits on first line.*/
           if (!contin && (remainval==nchar) && 
                      (finalnamelen+vlen+remaincom+3 < FLEN_CARD) &&
                      remaincom < fixedSpaceForComments-3)
              allInOne=1;
           
           if (!allInOne)
           {   
              /* There are 2 situations which require overwriting the last char of
                 valstring with a continue symbol '&' */
              if (!spaceForComments && (remaincom || (remainval > nchar)))

              {
                  nchar -= 1;        /* outputting one less character now */

                  if (valstring[vlen-2] != '\'')
                      valstring[vlen-2] = '&';  /*  overwrite last char with &  */
                  else
                  { /* last char was a pair of single quotes, so over write both */
                      valstring[vlen-3] = '&';
                      valstring[vlen-1] = '\0';
                  }
              }
              else if ( 
               /* Cases where '&' should be appended to valstring rather than
                   overwritten.  This would mostly be due to the inclusion
                   of a comment string requiring additional lines.  But there's
                   also the obscure case where the last character that can
                   fit happened to be a single quote.  Since this was removed
                   with the earlier 'nchar = minvlaue()' test, the valstring
                   must be continued even though it's one space short of filling
                   this line.  We then append it with a '&'. */


              (spaceForComments && nchar < remainval) || 
              (remaincom && (spaceForComments < fixedSpaceForComments ||
                        spaceForComments-3 < remaincom ||
                        remaincom > fixedSpaceForComments-3))) 
              {
                valstring[vlen-1] = '&';
                 valstring[vlen] = '\'';
                 valstring[vlen+1] = '\0';
                 vlen+=1;
              }
           }
           
           if (allInOne)
           {
              nocomment=0;
              /* The allInOne test ensures that comm length will
                 fit within FLEN_CARD buffer size */
              if (comm)
                 strcpy(comstring, comm);
              else
                 comstring[0]='\0';
              /* Ensure that loop exits after this iteration */
              remainval=0;
              remaincom=0;
           }
           else if (remainval > nchar)
           {
              nocomment = 1;
              remainval -= nchar;
              next  += nchar;
              maxvalchars = (FLEN_CARD-1) - 12;
           }
           else
           {
              /* We've reached the end of val input.  Now switch to writing
                 comment (if any).  This block can only be reached once. */
              /* Do not write comments on this line if fewer than
                 fixedSpaceForComments are available for the comment string 
                 and " / ". */
              nocomment = 1;
              remainval = 0;
              next = 0;
              processingComment = 1;
              if (remaincom && spaceForComments >= fixedSpaceForComments)
              {
                 nocomment = 0;
                 nchar = minvalue(remaincom, fixedSpaceForComments-3);
                 strncpy(comstring, comm, nchar);
                 comstring[nchar] = '\0';
                 next = nchar;
                 remaincom -= nchar;
              }
           }

        } /* end if processing valstring and not comment */

        if (contin)           /* This is a CONTINUEd keyword */
        {
           if (nocomment) {
               ffmkky("CONTINUE", valstring, NULL, card, status); /* make keyword w/o comment */
           } else {
               ffmkky("CONTINUE", valstring, comstring, card, status); /* make keyword */
	   }
           strncpy(&card[8], "   ",  2);  /* overwrite the '=' */
        }
        else
        {
           if (nocomment)
              ffmkky(keyname, valstring, NULL, card, status);  /* make keyword */
           else
              ffmkky(keyname, valstring, comstring, card, status);  /* make keyword */
        }

        if (position < 0)
           ffprec(fptr, card, status);  /* write the keyword */
        else
        {
           ffirec(fptr, position, card, status);  /* insert the keyword */
           ++position;
        }
           
        contin = 1;
        nocomment = 0;
        addline = (int)(remainval > 0 || remaincom > 0);
    }
    return(*status);
}